

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O0

void mahjong::adjust_by_suits(tile_t *tiles,intptr_t tile_cnt,fan_table_t *fan_table)

{
  bool bVar1;
  uint uVar2;
  long local_38;
  intptr_t i;
  uint8_t suit_flag;
  fan_table_t *fan_table_local;
  intptr_t tile_cnt_local;
  tile_t *tiles_local;
  
  i._7_1_ = 0;
  for (local_38 = 0; local_38 < tile_cnt; local_38 = local_38 + 1) {
    i._7_1_ = i._7_1_ | (byte)(1 << (sbyte)((int)(uint)tiles[local_38] >> 4));
  }
  if ((i._7_1_ & 0xf1) == 0) {
    (*fan_table)[0x4c] = 1;
  }
  if ((i._7_1_ & 0xe3) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  if ((i._7_1_ & 0xe5) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  if ((i._7_1_ & 0xe9) == 0) {
    (*fan_table)[0x4b] = (*fan_table)[0x4b] + 1;
  }
  if ((*fan_table)[0x4b] == 2) {
    (*fan_table)[0x4b] = 0;
    uVar2 = 0x16;
    if ((i._7_1_ & 0xf1) != 0) {
      uVar2 = 0x31;
    }
    (*fan_table)[uVar2] = 1;
  }
  if (((i._7_1_ == 0x1e) &&
      (bVar1 = std::any_of<unsigned_char_const*,bool(*)(unsigned_char)>
                         (tiles,tiles + tile_cnt,is_winds), bVar1)) &&
     (bVar1 = std::any_of<unsigned_char_const*,bool(*)(unsigned_char)>
                        (tiles,tiles + tile_cnt,is_dragons), bVar1)) {
    (*fan_table)[0x33] = 1;
  }
  return;
}

Assistant:

static void adjust_by_suits(const tile_t *tiles, intptr_t tile_cnt, fan_table_t &fan_table) {
    // 打表标记有哪些花色，用bit操作
    uint8_t suit_flag = 0;
    for (intptr_t i = 0; i < tile_cnt; ++i) {
        suit_flag |= (1 << tile_get_suit(tiles[i]));
    }

    // 1111 0001
    if (!(suit_flag & 0xF1U)) {
        fan_table[NO_HONORS] = 1;  // 无字
    }

    // 1110 0011
    if (!(suit_flag & 0xE3U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（万）
    }
    // 1110 0101
    if (!(suit_flag & 0xE5U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（条）
    }
    // 1110 1001
    if (!(suit_flag & 0xE9U)) {
        ++fan_table[ONE_VOIDED_SUIT];  // 缺一门（饼）
    }

    // 当缺2门时，根据有字和无字，修正为混一色和清一色
    if (fan_table[ONE_VOIDED_SUIT] == 2) {
        fan_table[ONE_VOIDED_SUIT] = 0;
        fan_table[suit_flag & 0xF1U ? HALF_FLUSH : FULL_FLUSH] = 1;
    }

    // 0001 1110
    if (suit_flag == 0x1EU) {  // 三门数牌和字牌都有
        if (std::any_of(tiles, tiles + tile_cnt, &is_winds)
            && std::any_of(tiles, tiles + tile_cnt, &is_dragons)) {
            fan_table[ALL_TYPES] = 1;  // 五门齐
        }
    }
}